

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_helper.cpp
# Opt level: O0

NametableCell __thiscall
nesvis::PpuHelper::get_nametable_cell(PpuHelper *this,int x,int y,uint16_t nametable)

{
  int iVar1;
  IMmu *pIVar2;
  ushort uVar3;
  uint8_t tile_index;
  uint16_t address;
  uint16_t nametable_local;
  int y_local;
  int x_local;
  PpuHelper *this_local;
  
  uVar3 = nametable * 0x400 + 0x2000 + (short)y * 0x20 + (short)x;
  pIVar2 = n_e_s::nes::Nes::ppu_mmu(this->nes_);
  iVar1 = (*pIVar2->_vptr_IMmu[3])(pIVar2,(ulong)uVar3);
  this_local._4_4_ = (NametableCell)CONCAT22(uVar3,(ushort)(byte)iVar1);
  return this_local._4_4_;
}

Assistant:

PpuHelper::NametableCell PpuHelper::get_nametable_cell(int x,
        int y,
        uint16_t nametable) {
    // $2000-$23FF   $0400 Nametable 0
    // $2400-$27FF   $0400 Nametable 1
    // $2800-$2BFF   $0400 Nametable 2
    // $2C00-$2FFF   $0400 Nametable 3
    // $3000-$3EFF   $0F00 Mirrors of $2000-$2EFF
    const uint16_t address = 0x2000 + 0x0400 * nametable + y * 32 + x;
    const uint8_t tile_index = nes_->ppu_mmu().read_byte(address);

    return {.tile_index = tile_index, .address = address};
}